

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u8 uVar1;
  u32 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  u8 *aFrame;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  sqlite3_int64 sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int lockIdx;
  int iVar15;
  ulong uVar16;
  u32 local_d0;
  u32 pgno;
  u32 *local_c8;
  undefined8 uStack_c0;
  u8 aBuf [32];
  u32 *page0;
  i64 nSize;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  u32 *local_50;
  u8 *local_48;
  sqlite3_int64 local_40;
  u32 *aShare;
  
  iVar4 = walIndexPage(pWal,0,&page0);
  if (iVar4 != 0) {
    if (iVar4 != 0x508) {
      return iVar4;
    }
    pWal->bShmUnreliable = '\x01';
    pWal->exclusiveMode = '\x02';
    *pChanged = 1;
  }
  if ((page0 == (u32 *)0x0) || (iVar5 = walIndexTryHdr(pWal,pChanged), iVar5 != 0)) {
    if ((pWal->bShmUnreliable != '\0') || ((pWal->readOnly & 2) == 0)) {
      uVar1 = pWal->writeLock;
      if ((uVar1 != '\0') || (iVar4 = walLockExclusive(pWal,0,1), iVar4 == 0)) {
        pWal->writeLock = '\x01';
        iVar4 = 0;
        iVar5 = walIndexPage(pWal,0,&page0);
        if (iVar5 == 0) {
          iVar5 = walIndexTryHdr(pWal,pChanged);
          if (iVar5 == 0) {
            bVar3 = true;
          }
          else {
            iVar5 = 2 - (uint)pWal->ckptLock;
            lockIdx = pWal->ckptLock + 1;
            iVar4 = walLockExclusive(pWal,lockIdx,iVar5);
            if (iVar4 == 0) {
              (pWal->hdr).aSalt[0] = 0;
              (pWal->hdr).aSalt[1] = 0;
              (pWal->hdr).aCksum[0] = 0;
              (pWal->hdr).aCksum[1] = 0;
              (pWal->hdr).mxFrame = 0;
              (pWal->hdr).nPage = 0;
              (pWal->hdr).aFrameCksum[0] = 0;
              (pWal->hdr).aFrameCksum[1] = 0;
              local_c8 = (u32 *)0x0;
              uStack_c0 = 0;
              (pWal->hdr).iVersion = 0;
              (pWal->hdr).unused = 0;
              (pWal->hdr).iChange = 0;
              (pWal->hdr).isInit = '\0';
              (pWal->hdr).bigEndCksum = '\0';
              (pWal->hdr).szPage = 0;
              iVar4 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&nSize);
              if (iVar4 == 0) {
                if (0x20 < nSize) {
                  iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aBuf,0x20,0);
                  if (iVar4 != 0) goto LAB_0015cfda;
                  if ((aBuf[3] & 0xfffffffe |
                      ((uint)aBuf._0_4_ >> 0x10 & 0xff) << 8 |
                      ((uint)aBuf._0_4_ >> 8 & 0xff) << 0x10 | aBuf._0_4_ << 0x18) == 0x377f0682) {
                    uVar7 = ((uint)aBuf._8_4_ >> 8 & 0xff) << 0x10 | aBuf._8_4_ << 0x18;
                    uVar11 = ((uint)aBuf._8_4_ >> 0x10 & 0xff) << 8;
                    uVar12 = (uint)aBuf._8_4_ >> 0x18 | uVar7 | uVar11;
                    if (0xffff01fe < uVar12 - 0x10001 && (uVar12 & uVar12 - 1) == 0) {
                      (pWal->hdr).bigEndCksum = (u8)(aBuf[3] & 1);
                      pWal->szPage = uVar12;
                      pWal->nCkpt = (uint)aBuf._12_4_ >> 0x18 | (aBuf._12_4_ & 0xff0000) >> 8 |
                                    (aBuf._12_4_ & 0xff00) << 8 | aBuf._12_4_ << 0x18;
                      *(undefined8 *)(pWal->hdr).aSalt = aBuf._16_8_;
                      walChecksumBytes(aBuf[3] & 1 ^ 1,aBuf,0x18,(u32 *)0x0,(pWal->hdr).aFrameCksum)
                      ;
                      if (((pWal->hdr).aFrameCksum[0] ==
                           ((uint)aBuf._24_4_ >> 0x18 | (aBuf._24_4_ & 0xff0000) >> 8 |
                            (aBuf._24_4_ & 0xff00) << 8 | aBuf._24_4_ << 0x18)) &&
                         ((pWal->hdr).aFrameCksum[1] ==
                          ((uint)aBuf._28_4_ >> 0x18 | (aBuf._28_4_ & 0xff0000) >> 8 |
                           (aBuf._28_4_ & 0xff00) << 8 | aBuf._28_4_ << 0x18))) {
                        if (((uint)aBuf._4_4_ >> 0x18 | (aBuf._4_4_ & 0xff0000) >> 8 |
                             (aBuf._4_4_ & 0xff00) << 8 | aBuf._4_4_ << 0x18) == 0x2de218) {
                          uVar16 = (ulong)uVar12;
                          aFrame = (u8 *)sqlite3_malloc64(uVar16 + 0x8018);
                          if (aFrame == (u8 *)0x0) {
                            iVar4 = 7;
                          }
                          else {
                            lVar14 = uVar16 + 0x18;
                            local_48 = aFrame + 0x18;
                            local_70 = (nSize + -0x20) / lVar14;
                            local_68 = (ulong)((int)local_70 + 0x1000) + 0xffffffff021 >> 0xc;
                            local_70 = local_70 & 0xffffffff;
                            local_c8 = (u32 *)0x0;
                            uStack_c0 = 0;
                            uVar12 = 0;
                            iVar4 = 0;
                            while( true ) {
                              uVar13 = (ulong)uVar12;
                              if ((uint)local_68 < uVar12) break;
                              iVar4 = walIndexPage(pWal,uVar12,&aShare);
                              local_50 = aShare;
                              if (aShare == (u32 *)0x0) break;
                              uVar8 = (ulong)(uVar12 * 0x1000 + 0xfde);
                              if (local_70 < uVar8) {
                                uVar8 = local_70;
                              }
                              uVar10 = (ulong)(uVar12 * 0x1000 - 0x21);
                              if (uVar12 == 0) {
                                uVar10 = 1;
                              }
                              pWal->apWiData[uVar13] = (u32 *)(aFrame + uVar16 + 0x18);
                              sVar9 = (uVar10 - 1) * lVar14 + 0x20;
                              local_60 = uVar13;
                              local_58 = uVar13;
                              while( true ) {
                                if ((uVar8 < uVar10) ||
                                   (local_40 = sVar9,
                                   iVar4 = (*pWal->pWalFd->pMethods->xRead)
                                                     (pWal->pWalFd,aFrame,(int)lVar14,sVar9),
                                   iVar4 != 0)) goto LAB_0015ce37;
                                iVar4 = walDecodeFrame(pWal,&pgno,&local_d0,local_48,aFrame);
                                if (iVar4 == 0) break;
                                iVar4 = walIndexAppend(pWal,(u32)uVar10,pgno);
                                if (iVar4 != 0) goto LAB_0015ce37;
                                if (local_d0 != 0) {
                                  (pWal->hdr).mxFrame = (u32)uVar10;
                                  (pWal->hdr).nPage = local_d0;
                                  (pWal->hdr).szPage = (ushort)(uVar7 >> 0x10) | (ushort)uVar11;
                                  local_c8 = *(u32 **)(pWal->hdr).aFrameCksum;
                                  uStack_c0 = 0;
                                }
                                uVar10 = uVar10 + 1;
                                sVar9 = local_40 + lVar14;
                                iVar4 = 0;
                              }
                              iVar4 = 0;
LAB_0015ce37:
                              iVar15 = (int)local_58;
                              pWal->apWiData[local_60] = local_50;
                              lVar6 = 0;
                              if (iVar15 == 0) {
                                lVar6 = 0x88;
                              }
                              memcpy((void *)((long)local_50 + lVar6),
                                     (u8 *)((long)(aFrame + uVar16 + 0x18) + lVar6),0x8000 - lVar6);
                              if (uVar10 <= uVar8) break;
                              uVar12 = iVar15 + 1;
                            }
                            sqlite3_free(aFrame);
                            if (iVar4 == 0) goto LAB_0015ced7;
                          }
                        }
                        else {
                          iVar4 = sqlite3CantopenError(0xfaaf);
                        }
                        goto LAB_0015cfda;
                      }
                    }
                  }
                }
LAB_0015ced7:
                *(u32 **)(pWal->hdr).aFrameCksum = local_c8;
                walIndexWriteHdr(pWal);
                local_c8 = *pWal->apWiData;
                local_c8[0x18] = 0;
                local_c8[0x20] = (pWal->hdr).mxFrame;
                local_c8[0x19] = 0;
                iVar4 = 0;
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  iVar15 = (int)lVar14 + 4;
                  iVar4 = walLockExclusive(pWal,iVar15,1);
                  if (iVar4 != 5) {
                    if (iVar4 != 0) goto LAB_0015cfda;
                    if ((lVar14 == 0) && (uVar2 = (pWal->hdr).mxFrame, uVar2 != 0)) {
                      local_c8[0x1a] = uVar2;
                    }
                    else {
                      local_c8[lVar14 + 0x1a] = 0xffffffff;
                    }
                    walUnlockExclusive(pWal,iVar15,1);
                  }
                }
                if ((pWal->hdr).nPage != 0) {
                  sqlite3_log(0x11b,"recovered %d frames from WAL file %s",
                              (ulong)(pWal->hdr).mxFrame,pWal->zWalName);
                }
              }
LAB_0015cfda:
              walUnlockExclusive(pWal,lockIdx,iVar5);
            }
            *pChanged = 1;
            bVar3 = false;
          }
        }
        else {
          bVar3 = false;
          iVar4 = iVar5;
        }
        if (uVar1 == '\0') {
          pWal->writeLock = '\0';
          walUnlockExclusive(pWal,0,1);
        }
        if (bVar3) goto LAB_0015d00d;
      }
      goto LAB_0015d023;
    }
    iVar4 = walLockShared(pWal,0);
    if (iVar4 != 0) goto LAB_0015d023;
    walUnlockShared(pWal,0);
    iVar4 = 0x108;
    if (pWal->bShmUnreliable == '\0') {
      return 0x108;
    }
  }
  else {
LAB_0015d00d:
    if ((pWal->hdr).iVersion != 0x2de218) {
      iVar4 = sqlite3CantopenError(0xff3a);
    }
LAB_0015d023:
    if (pWal->bShmUnreliable == '\0') {
      return iVar4;
    }
    if (iVar4 == 0) {
      iVar5 = 0;
      goto LAB_0015d04e;
    }
  }
  walIndexClose(pWal,0);
  pWal->bShmUnreliable = '\0';
  iVar5 = -1;
  if (iVar4 != 0x20a) {
    iVar5 = iVar4;
  }
LAB_0015d04e:
  pWal->exclusiveMode = '\0';
  return iVar5;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else{
      int bWriteLock = pWal->writeLock;
      if( bWriteLock || SQLITE_OK==(rc = walLockWriter(pWal)) ){
        pWal->writeLock = 1;
        if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
          badHdr = walIndexTryHdr(pWal, pChanged);
          if( badHdr ){
            /* If the wal-index header is still malformed even while holding
            ** a WRITE lock, it can only mean that the header is corrupted and
            ** needs to be reconstructed.  So run recovery to do exactly that.
            */
            rc = walIndexRecover(pWal);
            *pChanged = 1;
          }
        }
        if( bWriteLock==0 ){
          pWal->writeLock = 0;
          walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
        }
      }
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}